

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_test.cpp
# Opt level: O2

void __thiscall Boolean_SimpleCubeRegression_Test::TestBody(Boolean_SimpleCubeRegression_Test *this)

{
  undefined1 uVar1;
  long lVar2;
  char *message;
  Message local_e8 [2];
  AssertionResult gtest_ar;
  AssertHelper local_c8 [2];
  Manifold local_b8 [16];
  Manifold local_a8 [16];
  Manifold local_98 [16];
  Manifold result;
  
  lVar2 = manifold::ManifoldParams();
  uVar1 = *(undefined1 *)(lVar2 + 1);
  lVar2 = manifold::ManifoldParams();
  *(undefined1 *)(lVar2 + 1) = 1;
  manifold::Manifold::Cube(local_c8,0);
  manifold::Manifold::Rotate(-0.1,0.1,-1.0);
  manifold::Manifold::Cube(local_98,0);
  manifold::Manifold::operator+((Manifold *)&gtest_ar,(Manifold *)local_e8);
  manifold::Manifold::Cube(local_b8,0);
  manifold::Manifold::Rotate(-0.1,-0.10000000000066571,-1.0);
  manifold::Manifold::operator-(&result,(Manifold *)&gtest_ar);
  manifold::Manifold::~Manifold(local_a8);
  manifold::Manifold::~Manifold(local_b8);
  manifold::Manifold::~Manifold((Manifold *)&gtest_ar);
  manifold::Manifold::~Manifold(local_98);
  manifold::Manifold::~Manifold((Manifold *)local_e8);
  manifold::Manifold::~Manifold((Manifold *)local_c8);
  local_e8[0].ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = manifold::Manifold::Status();
  local_c8[0].data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<manifold::Manifold::Error,manifold::Manifold::Error>
            ((internal *)&gtest_ar,"result.Status()","Manifold::Error::NoError",(Error *)local_e8,
             (Error *)local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/boolean_test.cpp"
               ,0x1bf,message);
    testing::internal::AssertHelper::operator=(local_c8,local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    if ((long *)CONCAT44(local_e8[0].ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_e8[0].ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_e8[0].ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_e8[0].ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  lVar2 = manifold::ManifoldParams();
  *(undefined1 *)(lVar2 + 1) = uVar1;
  manifold::Manifold::~Manifold(&result);
  return;
}

Assistant:

TEST(Boolean, SimpleCubeRegression) {
  const bool selfIntersectionChecks = ManifoldParams().selfIntersectionChecks;
  ManifoldParams().selfIntersectionChecks = true;
  Manifold result =
      Manifold::Cube().Rotate(-0.10000000000000001, 0.10000000000000001, -1.) +
      Manifold::Cube() -
      Manifold::Cube().Rotate(-0.10000000000000001, -0.10000000000066571, -1.);
  EXPECT_EQ(result.Status(), Manifold::Error::NoError);
  ManifoldParams().selfIntersectionChecks = selfIntersectionChecks;
}